

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.cpp
# Opt level: O0

void __thiscall antlr::TreeParser::traceIn(TreeParser *this,char *rname,RefAST *t)

{
  ostream *poVar1;
  AST *pAVar2;
  AST *pAVar3;
  TreeParserInputState *pTVar4;
  ASTRefCount *in_RDX;
  char *in_RSI;
  char *pcVar5;
  long *in_RDI;
  char *local_70;
  bool local_39;
  string local_38 [40];
  char *local_10;
  
  *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x60))();
  poVar1 = std::operator<<((ostream *)&std::cout,"> ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1,"(");
  pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar2 == (AST *)0x0) {
    local_70 = "null";
  }
  else {
    pAVar3 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDX);
    (*pAVar3->_vptr_AST[0x18])(local_38);
    local_70 = (char *)std::__cxx11::string::c_str();
  }
  local_39 = pAVar2 != (AST *)0x0;
  poVar1 = std::operator<<(poVar1,local_70);
  poVar1 = std::operator<<(poVar1,")");
  pTVar4 = RefCount<antlr::TreeParserInputState>::operator->
                     ((RefCount<antlr::TreeParserInputState> *)(in_RDI + 2));
  pcVar5 = "";
  if (0 < pTVar4->guessing) {
    pcVar5 = " [guessing]";
  }
  poVar1 = std::operator<<(poVar1,pcVar5);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (local_39) {
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void TreeParser::traceIn(const char* rname, RefAST t)
{
	traceDepth++;
	traceIndent();

	ANTLR_USE_NAMESPACE(std)cout << "> " << rname
			<< "(" << (t ? t->toString().c_str() : "null") << ")"
			<< ((inputState->guessing>0)?" [guessing]":"")
			<< ANTLR_USE_NAMESPACE(std)endl;
}